

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_stream.cpp
# Opt level: O2

void __thiscall
create::SerialStream::SerialStream
          (SerialStream *this,shared_ptr<create::Data> *d,uint8_t *header,
          bool install_signal_handler)

{
  __shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&d->super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>);
  Serial::Serial(&this->super_Serial,(shared_ptr<create::Data> *)&local_30,install_signal_handler);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  (this->super_Serial)._vptr_Serial = (_func_int **)&PTR_startSensorStream_001692a8;
  this->readState = READ_HEADER;
  this->headerByte = *header;
  return;
}

Assistant:

SerialStream::SerialStream(std::shared_ptr<Data> d, const uint8_t& header, bool install_signal_handler) : Serial(d, install_signal_handler), readState(READ_HEADER), headerByte(header) {
  }